

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O2

Context * Rml::GetContext(int index)

{
  int iVar1;
  CoreData *pCVar2;
  iterator it;
  iterator local_28;
  
  if (index < 0) {
    return (Context *)0x0;
  }
  iVar1 = GetNumContexts();
  if (index < iVar1) {
    pCVar2 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    local_28 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&pCVar2->contexts);
    ::std::
    advance<robin_hood::detail::Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::Iter<false>,int>
              (&local_28,index);
    pCVar2 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    if (local_28.mKeyVals != (NodePtr)(pCVar2->contexts).mInfo) {
      return ((local_28.mKeyVals)->mData).second._M_t.
             super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>._M_t.
             super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
             super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl;
    }
  }
  return (Context *)0x0;
}

Assistant:

Context* GetContext(int index)
{
	if (index < 0 || index >= GetNumContexts())
		return nullptr;

	auto it = core_data->contexts.begin();
	std::advance(it, index);

	if (it == core_data->contexts.end())
		return nullptr;

	return it->second.get();
}